

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<86UL> * __thiscall
mserialize::cx_strcat<1ul,1ul,30ul,1ul,6ul,3ul,6ul,4ul,10ul,16ul,7ul,1ul>
          (cx_string<86UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<1UL> *strings_1,cx_string<30UL> *strings_2,cx_string<1UL> *strings_3,
          cx_string<6UL> *strings_4,cx_string<3UL> *strings_5,cx_string<6UL> *strings_6,
          cx_string<4UL> *strings_7,cx_string<10UL> *strings_8,cx_string<16UL> *strings_9,
          cx_string<7UL> *strings_10,cx_string<1UL> *strings_11)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  char buffer [87];
  ulong auStack_148 [14];
  long lStack_d8;
  mserialize *local_d0;
  cx_string<1UL> *local_c8;
  cx_string<1UL> *local_c0;
  cx_string<30UL> *local_b8;
  cx_string<1UL> *local_b0;
  cx_string<6UL> *local_a8;
  cx_string<3UL> *pcStack_a0;
  cx_string<6UL> *local_98;
  cx_string<4UL> *pcStack_90;
  cx_string<10UL> *local_88;
  cx_string<16UL> *pcStack_80;
  cx_string<7UL> *local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined7 uStack_20;
  undefined1 uStack_19;
  undefined7 uStack_18;
  
  puVar1 = &local_68;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  uStack_19 = 0;
  uStack_18 = 0;
  local_d0 = this;
  local_c8 = strings;
  local_c0 = strings_1;
  local_b8 = strings_2;
  local_b0 = strings_3;
  local_a8 = strings_4;
  pcStack_a0 = strings_5;
  local_98 = strings_6;
  pcStack_90 = strings_7;
  local_88 = strings_8;
  pcStack_80 = strings_9;
  local_78 = strings_10;
  lVar2 = 1;
  auStack_148[1] = 1;
  auStack_148[2] = 1;
  auStack_148[3] = 0x1e;
  auStack_148[4] = 1;
  auStack_148[5] = 6;
  auStack_148[6] = 3;
  auStack_148[7] = 6;
  auStack_148[8] = 4;
  auStack_148[9] = 10;
  auStack_148[10] = 0x10;
  auStack_148[0xb] = 7;
  auStack_148[0xc] = 1;
  do {
    if (auStack_148[lVar2] != 0) {
      uVar3 = 0;
      do {
        *(undefined1 *)((long)puVar1 + uVar3) = *(undefined1 *)((&lStack_d8)[lVar2] + uVar3);
        uVar3 = uVar3 + 1;
      } while (uVar3 < auStack_148[lVar2]);
      puVar1 = (undefined8 *)((long)puVar1 + uVar3);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xd);
  __return_storage_ptr__->_data[0x56] = '\0';
  memcpy(__return_storage_ptr__,&local_68,0x56);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}